

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O2

int __thiscall YAML::RegEx::Match<YAML::StringCharSource>(RegEx *this,StringCharSource *source)

{
  int iVar1;
  
  if ((0xfffffffd < this->m_op - REGEX_OR) && (source->m_size <= source->m_offset)) {
    return -1;
  }
  iVar1 = MatchUnchecked<YAML::StringCharSource>(this,source);
  return iVar1;
}

Assistant:

inline bool RegEx::IsValidSource<StringCharSource>(
    const StringCharSource& source) const {
  switch (m_op) {
    case REGEX_MATCH:
    case REGEX_RANGE:
      return source;
    default:
      return true;
  }
}